

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O2

void __thiscall PatchAddGolasHeart::alter_world(PatchAddGolasHeart *this,World *w)

{
  vector<MapConnection,_std::allocator<MapConnection>_> *this_00;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  MapPalette *pMVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Color CVar12;
  Color CVar13;
  Color CVar14;
  Color CVar15;
  Color CVar16;
  Color CVar17;
  Color CVar18;
  Color CVar19;
  Color CVar20;
  Color CVar21;
  value_type vVar22;
  Color CVar23;
  Color CVar24;
  Color CVar25;
  Color CVar26;
  Color CVar27;
  Color CVar28;
  Color CVar29;
  Color CVar30;
  Color CVar31;
  array<Color,_13UL> *this_01;
  array<Color,_13UL> *this_02;
  Map *pMVar32;
  reference pvVar33;
  Map *pMVar34;
  MapPalette *palette;
  Entity *pEVar35;
  uint8_t i;
  size_type __n;
  Attributes local_2d8;
  array<Color,_13UL> *local_288;
  array<Color,_13UL> *local_280;
  undefined1 local_278 [32];
  _Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> _Stack_258;
  undefined **local_240;
  uint16_t local_238;
  uint8_t local_236;
  undefined2 local_230;
  bool local_22e;
  undefined1 local_228 [32];
  _Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> _Stack_208;
  undefined **local_1f0;
  uint16_t local_1e8;
  uint8_t local_1e6;
  undefined2 local_1e0;
  bool local_1de;
  MapPalette *local_1d0;
  Attributes local_1c8;
  Attributes local_178;
  Attributes local_128;
  Attributes local_d0;
  Attributes local_80;
  
  this_02 = (array<Color,_13UL> *)operator_new(0x34);
  pMVar32 = World::map(w,0x131);
  pMVar6 = pMVar32->_palette;
  this_02->_M_elems[0xc] = (pMVar6->super_array<Color,_13UL>)._M_elems[0xc];
  uVar7 = *(undefined8 *)(pMVar6->super_array<Color,_13UL>)._M_elems;
  uVar8 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 2);
  uVar9 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 4);
  uVar10 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 6);
  uVar11 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)(this_02->_M_elems + 8) =
       *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)(this_02->_M_elems + 10) = uVar11;
  *(undefined8 *)(this_02->_M_elems + 4) = uVar9;
  *(undefined8 *)(this_02->_M_elems + 6) = uVar10;
  *(undefined8 *)this_02->_M_elems = uVar7;
  *(undefined8 *)(this_02->_M_elems + 2) = uVar8;
  Color::Color((Color *)&local_2d8,0x80,' ',' ');
  CVar12._b = local_2d8.position.y;
  CVar12._invalid = (bool)local_2d8.position.z;
  CVar12._r = local_2d8.type_id;
  CVar12._g = local_2d8.position.x;
  this_02->_M_elems[1] = CVar12;
  Color::Color((Color *)&local_2d8,0xa0,'@',' ');
  CVar13._b = local_2d8.position.y;
  CVar13._invalid = (bool)local_2d8.position.z;
  CVar13._r = local_2d8.type_id;
  CVar13._g = local_2d8.position.x;
  this_02->_M_elems[2] = CVar13;
  Color::Color((Color *)&local_2d8,0xc0,'`','@');
  CVar14._b = local_2d8.position.y;
  CVar14._invalid = (bool)local_2d8.position.z;
  CVar14._r = local_2d8.type_id;
  CVar14._g = local_2d8.position.x;
  this_02->_M_elems[3] = CVar14;
  Color::Color((Color *)&local_2d8,'`',' ',' ');
  CVar15._b = local_2d8.position.y;
  CVar15._invalid = (bool)local_2d8.position.z;
  CVar15._r = local_2d8.type_id;
  CVar15._g = local_2d8.position.x;
  this_02->_M_elems[5] = CVar15;
  Color::Color((Color *)&local_2d8,'`','@','@');
  CVar16._b = local_2d8.position.y;
  CVar16._invalid = (bool)local_2d8.position.z;
  CVar16._r = local_2d8.type_id;
  CVar16._g = local_2d8.position.x;
  this_02->_M_elems[6] = CVar16;
  Color::Color((Color *)&local_2d8,0xa0,'`','`');
  CVar17._b = local_2d8.position.y;
  CVar17._invalid = (bool)local_2d8.position.z;
  CVar17._r = local_2d8.type_id;
  CVar17._g = local_2d8.position.x;
  this_02->_M_elems[7] = CVar17;
  Color::Color((Color *)&local_2d8,0xa0,'`',' ');
  CVar18._b = local_2d8.position.y;
  CVar18._invalid = (bool)local_2d8.position.z;
  CVar18._r = local_2d8.type_id;
  CVar18._g = local_2d8.position.x;
  this_02->_M_elems[8] = CVar18;
  Color::Color((Color *)&local_2d8,0x80,'\0','\0');
  CVar19._b = local_2d8.position.y;
  CVar19._invalid = (bool)local_2d8.position.z;
  CVar19._r = local_2d8.type_id;
  CVar19._g = local_2d8.position.x;
  this_02->_M_elems[9] = CVar19;
  Color::Color((Color *)&local_2d8,0xe0,'@','@');
  CVar20._b = local_2d8.position.y;
  CVar20._invalid = (bool)local_2d8.position.z;
  CVar20._r = local_2d8.type_id;
  CVar20._g = local_2d8.position.x;
  this_02->_M_elems[10] = CVar20;
  Color::Color((Color *)&local_2d8,0xe0,0x80,0x80);
  CVar21._b = local_2d8.position.y;
  CVar21._invalid = (bool)local_2d8.position.z;
  CVar21._r = local_2d8.type_id;
  CVar21._g = local_2d8.position.x;
  this_02->_M_elems[0xb] = CVar21;
  World::add_map_palette(w,(MapPalette *)this_02);
  pMVar32 = World::map(w,0x156);
  local_288 = &build_greyscale_palette(w,pMVar32->_palette,1.0)->super_array<Color,_13UL>;
  local_280 = (array<Color,_13UL> *)operator_new(0x34);
  local_280->_M_elems[0]._r = '\0';
  local_280->_M_elems[0]._g = '\0';
  local_280->_M_elems[0]._b = '\0';
  local_280->_M_elems[0]._invalid = false;
  local_280->_M_elems[1]._r = '\0';
  local_280->_M_elems[1]._g = '\0';
  local_280->_M_elems[1]._b = '\0';
  local_280->_M_elems[1]._invalid = false;
  local_280->_M_elems[2]._r = '\0';
  local_280->_M_elems[2]._g = '\0';
  local_280->_M_elems[2]._b = '\0';
  local_280->_M_elems[2]._invalid = false;
  local_280->_M_elems[3]._r = '\0';
  local_280->_M_elems[3]._g = '\0';
  local_280->_M_elems[3]._b = '\0';
  local_280->_M_elems[3]._invalid = false;
  local_280->_M_elems[4]._r = '\0';
  local_280->_M_elems[4]._g = '\0';
  local_280->_M_elems[4]._b = '\0';
  local_280->_M_elems[4]._invalid = false;
  local_280->_M_elems[5]._r = '\0';
  local_280->_M_elems[5]._g = '\0';
  local_280->_M_elems[5]._b = '\0';
  local_280->_M_elems[5]._invalid = false;
  local_280->_M_elems[6]._r = '\0';
  local_280->_M_elems[6]._g = '\0';
  local_280->_M_elems[6]._b = '\0';
  local_280->_M_elems[6]._invalid = false;
  local_280->_M_elems[7]._r = '\0';
  local_280->_M_elems[7]._g = '\0';
  local_280->_M_elems[7]._b = '\0';
  local_280->_M_elems[7]._invalid = false;
  local_280->_M_elems[8]._r = '\0';
  local_280->_M_elems[8]._g = '\0';
  local_280->_M_elems[8]._b = '\0';
  local_280->_M_elems[8]._invalid = false;
  local_280->_M_elems[9]._r = '\0';
  local_280->_M_elems[9]._g = '\0';
  local_280->_M_elems[9]._b = '\0';
  local_280->_M_elems[9]._invalid = false;
  local_280->_M_elems[10]._r = '\0';
  local_280->_M_elems[10]._g = '\0';
  local_280->_M_elems[10]._b = '\0';
  local_280->_M_elems[10]._invalid = false;
  local_280->_M_elems[0xb]._r = '\0';
  local_280->_M_elems[0xb]._g = '\0';
  local_280->_M_elems[0xb]._b = '\0';
  local_280->_M_elems[0xb]._invalid = false;
  local_280->_M_elems[0xc]._r = '\0';
  local_280->_M_elems[0xc]._g = '\0';
  local_280->_M_elems[0xc]._b = '\0';
  local_280->_M_elems[0xc]._invalid = false;
  std::array<Color,_13UL>::array(local_280);
  this_01 = local_288;
  for (__n = 0; __n != 0xd; __n = __n + 1) {
    pvVar33 = std::array<Color,_13UL>::at(this_02,__n);
    bVar1 = pvVar33->_r;
    pvVar33 = std::array<Color,_13UL>::at(this_01,__n);
    bVar2 = pvVar33->_r;
    pvVar33 = std::array<Color,_13UL>::at(this_02,__n);
    bVar3 = pvVar33->_g;
    pvVar33 = std::array<Color,_13UL>::at(this_01,__n);
    bVar4 = pvVar33->_b;
    pvVar33 = std::array<Color,_13UL>::at(this_02,__n);
    bVar5 = pvVar33->_b;
    pvVar33 = std::array<Color,_13UL>::at(this_01,__n);
    Color::Color((Color *)&local_2d8,(uint8_t)((uint)bVar2 + (uint)bVar1 >> 1),
                 (uint8_t)((uint)bVar4 + (uint)bVar3 >> 1),
                 (uint8_t)((uint)pvVar33->_b + (uint)bVar5 >> 1));
    pvVar33 = std::array<Color,_13UL>::at(local_280,__n);
    vVar22._b = local_2d8.position.y;
    vVar22._invalid = (bool)local_2d8.position.z;
    vVar22._r = local_2d8.type_id;
    vVar22._g = local_2d8.position.x;
    *pvVar33 = vVar22;
  }
  World::add_map_palette(w,(MapPalette *)local_280);
  pMVar32 = World::map(w,0x6f);
  local_1d0 = build_greyscale_palette(w,pMVar32->_palette,0.4);
  pMVar32 = World::map(w,0x39);
  pMVar34 = World::map(w,0x20c);
  pMVar32->_layout = pMVar34->_layout;
  pMVar34 = World::map(w,0x20c);
  pMVar32->_blockset = pMVar34->_blockset;
  palette = (MapPalette *)operator_new(0x34);
  pMVar34 = World::map(w,0x20c);
  pMVar6 = pMVar34->_palette;
  (palette->super_array<Color,_13UL>)._M_elems[0xc] =
       (pMVar6->super_array<Color,_13UL>)._M_elems[0xc];
  uVar7 = *(undefined8 *)(pMVar6->super_array<Color,_13UL>)._M_elems;
  uVar8 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 2);
  uVar9 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 4);
  uVar10 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 6);
  uVar11 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 8) =
       *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 10) = uVar11;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 4) = uVar9;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 6) = uVar10;
  *(undefined8 *)(palette->super_array<Color,_13UL>)._M_elems = uVar7;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 2) = uVar8;
  Color::Color((Color *)&local_2d8,0x80,'\0','\0');
  CVar23._b = local_2d8.position.y;
  CVar23._invalid = (bool)local_2d8.position.z;
  CVar23._r = local_2d8.type_id;
  CVar23._g = local_2d8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[0] = CVar23;
  Color::Color((Color *)&local_2d8,'@','\0',' ');
  CVar24._b = local_2d8.position.y;
  CVar24._invalid = (bool)local_2d8.position.z;
  CVar24._r = local_2d8.type_id;
  CVar24._g = local_2d8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[3] = CVar24;
  Color::Color((Color *)&local_2d8,0x80,'@','\0');
  CVar25._b = local_2d8.position.y;
  CVar25._invalid = (bool)local_2d8.position.z;
  CVar25._r = local_2d8.type_id;
  CVar25._g = local_2d8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[4] = CVar25;
  Color::Color((Color *)&local_2d8,0xc0,'@','\0');
  CVar26._b = local_2d8.position.y;
  CVar26._invalid = (bool)local_2d8.position.z;
  CVar26._r = local_2d8.type_id;
  CVar26._g = local_2d8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[5] = CVar26;
  Color::Color((Color *)&local_2d8,0xe0,'@','@');
  CVar27._b = local_2d8.position.y;
  CVar27._invalid = (bool)local_2d8.position.z;
  CVar27._r = local_2d8.type_id;
  CVar27._g = local_2d8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[8] = CVar27;
  Color::Color((Color *)&local_2d8,'`','\0','\0');
  CVar28._b = local_2d8.position.y;
  CVar28._invalid = (bool)local_2d8.position.z;
  CVar28._r = local_2d8.type_id;
  CVar28._g = local_2d8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[9] = CVar28;
  Color::Color((Color *)&local_2d8,0x80,' ',' ');
  CVar29._b = local_2d8.position.y;
  CVar29._invalid = (bool)local_2d8.position.z;
  CVar29._r = local_2d8.type_id;
  CVar29._g = local_2d8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[10] = CVar29;
  Color::Color((Color *)&local_2d8,0x80,'@','@');
  CVar30._b = local_2d8.position.y;
  CVar30._invalid = (bool)local_2d8.position.z;
  CVar30._r = local_2d8.type_id;
  CVar30._g = local_2d8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[0xb] = CVar30;
  Color::Color((Color *)&local_2d8,0x80,'`','`');
  CVar31._b = local_2d8.position.y;
  CVar31._invalid = (bool)local_2d8.position.z;
  CVar31._r = local_2d8.type_id;
  CVar31._g = local_2d8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[0xc] = CVar31;
  World::add_map_palette(w,palette);
  pMVar32->_palette = palette;
  pMVar32->_background_music = '\x14';
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = 'b';
  local_2d8.position.x = ',';
  local_2d8.position.y = '\x14';
  local_2d8.position.z = '\x06';
  local_2d8.behavior_id = 0;
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  local_2d8.palette = '\0';
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.dialogue = '\0';
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = 'b';
  local_228[1] = '+';
  local_228[2] = '\x16';
  local_228[3] = '\x06';
  local_228._18_2_ = 0;
  local_228[4] = false;
  local_228[5] = false;
  local_228[6] = false;
  local_228[7] = '\0';
  local_228[8] = '\0';
  local_228[9] = '\0';
  local_228[10] = false;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = false;
  local_228[0xf] = false;
  local_228[0x10] = '\0';
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = 'b';
  local_278[1] = '+';
  local_278[2] = '\x15';
  local_278[3] = '\b';
  local_278[4] = true;
  local_278._18_2_ = 0;
  local_278[5] = false;
  local_278[6] = false;
  local_278[7] = '\0';
  local_278[8] = '\0';
  local_278[9] = '\0';
  local_278[10] = false;
  local_278[0xb] = false;
  local_278[0xc] = false;
  local_278[0xd] = false;
  local_278[0xe] = false;
  local_278[0xf] = false;
  local_278[0x10] = '\0';
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  this->_room_1 = pMVar32;
  pMVar32 = World::map(w,0x3a);
  pMVar34 = World::map(w,0x152);
  pMVar32->_layout = pMVar34->_layout;
  pMVar34 = World::map(w,0x152);
  pMVar32->_blockset = pMVar34->_blockset;
  pMVar32->_palette = (MapPalette *)this_02;
  pMVar32->_background_music = '\x14';
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = 0x9c;
  local_2d8.position.x = '\x19';
  local_2d8.position.y = '\x1c';
  local_2d8.position.z = '\x02';
  local_2d8.position.half_x = true;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\x02';
  local_2d8.palette = '\x01';
  local_2d8.behavior_id = 0;
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.dialogue = '\0';
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  Map::add_entity(pMVar32,pEVar35);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_228,
             "Foxy: At long last, you\'ve come!\nYou are inside Gola\'s heart,\nthe source of all its power.\x1e\nWhat you are about to face in\nhere is incredibly powerful,\nbut I have faith in you.\x1e\nGood luck. You will need it.\x03"
             ,(allocator<char> *)local_278);
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar35,(string *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  this->_room_2 = pMVar32;
  this_00 = &w->_map_connections;
  local_2d8._0_2_ = this->_room_1->_id;
  local_2d8._6_2_ = pMVar32->_id;
  local_2d8.position.y = '!';
  local_2d8.position.z = '0';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\x19';
  local_2d8.speed = '\"';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = World::map(w,0xe1);
  pMVar34 = World::map(w,0x15a);
  pMVar32->_layout = pMVar34->_layout;
  pMVar34 = World::map(w,0x15a);
  pMVar32->_blockset = pMVar34->_blockset;
  pMVar32->_palette = (MapPalette *)this_02;
  pMVar32->_background_music = '\x14';
  local_2d8.palette = 0xce;
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.type_id = 0xc0;
  local_2d8.position.x = 'k';
  local_2d8.position.y = '$';
  local_2d8.position.z = '\0';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar32->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2d8);
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = 'h';
  local_2d8.position.x = '\x19';
  local_2d8.position.y = '\x11';
  local_2d8.position.z = '\x02';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  local_2d8.palette = '\0';
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.dialogue = '\0';
  local_2d8.behavior_id = 0x6a;
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = 'Q';
  local_228[1] = '\x19';
  local_228[2] = '\x12';
  local_228[3] = '\x05';
  local_228[4] = true;
  local_228[5] = false;
  local_228[6] = false;
  local_228[7] = '\0';
  local_228._18_2_ = 0;
  local_228[8] = '\x01';
  local_228[9] = '\0';
  local_228[10] = false;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = false;
  local_228[0xf] = false;
  local_228[0x10] = '\0';
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = 'g';
  local_278[1] = '\x19';
  local_278[2] = '!';
  local_278[3] = '\x02';
  local_278[4] = false;
  local_278[5] = false;
  local_278[6] = false;
  local_278[7] = '\0';
  local_278[8] = '\0';
  local_278[9] = '\0';
  local_278[10] = false;
  local_278[0xb] = false;
  local_278[0xc] = false;
  local_278[0xd] = true;
  local_278[0xe] = false;
  local_278[0xf] = false;
  local_278[0x10] = '\0';
  local_278._18_2_ = 0x6a;
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  pEVar35 = (Entity *)operator_new(0x58);
  local_1c8.type_id = 0xaa;
  local_1c8.position.x = '\x15';
  local_1c8.position.y = '\x19';
  local_1c8.position.z = '\b';
  local_1c8.position.half_x = false;
  local_1c8.position.half_y = false;
  local_1c8.position.half_z = false;
  local_1c8.orientation = '\x01';
  local_1c8.behavior_id = 0;
  local_1c8.palette = '\x01';
  local_1c8.speed = '\0';
  local_1c8.fightable = false;
  local_1c8.liftable = false;
  local_1c8.can_pass_through = false;
  local_1c8.appear_after_player_moved_away = false;
  local_1c8.gravity_immune = false;
  local_1c8.talkable = false;
  local_1c8.dialogue = '\0';
  local_1c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1c8.persistence_flag.byte = 0xff;
  local_1c8.persistence_flag.bit = 0xff;
  local_1c8.flag_unknown_2_3 = false;
  local_1c8.flag_unknown_2_4 = false;
  local_1c8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_1c8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_1c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_178.type_id = 0xaa;
  local_178.position.x = '\x1e';
  local_178.position.y = '\x19';
  local_178.position.z = '\b';
  local_178.position.half_x = false;
  local_178.position.half_y = false;
  local_178.position.half_z = false;
  local_178.orientation = '\x03';
  local_178.palette = '\x01';
  local_178.behavior_id = 0;
  local_178.speed = '\0';
  local_178.fightable = false;
  local_178.liftable = false;
  local_178.can_pass_through = false;
  local_178.appear_after_player_moved_away = false;
  local_178.gravity_immune = false;
  local_178.talkable = false;
  local_178.dialogue = '\0';
  local_178.entity_to_use_tiles_from = (Entity *)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_178.persistence_flag.byte = 0xff;
  local_178.persistence_flag.bit = 0xff;
  local_178.flag_unknown_2_3 = false;
  local_178.flag_unknown_2_4 = false;
  local_178.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_178);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_178.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  this->_room_3 = pMVar32;
  local_2d8._0_2_ = this->_room_2->_id;
  local_2d8._6_2_ = pMVar32->_id;
  local_2d8.position.y = '\x19';
  local_2d8.position.z = '\x17';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\x19';
  local_2d8.speed = '\"';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = World::map(w,0x3d);
  pMVar34 = World::map(w,0x148);
  pMVar32->_layout = pMVar34->_layout;
  pMVar34 = World::map(w,0x148);
  pMVar32->_blockset = pMVar34->_blockset;
  pMVar32->_palette = (MapPalette *)this_02;
  pMVar32->_background_music = '\x14';
  (pMVar32->_visited_flag).bit = '\0';
  (pMVar32->_visited_flag).byte = 0xce;
  local_2d8.palette = 0xce;
  local_2d8.speed = '\0';
  local_2d8.fightable = true;
  local_2d8.liftable = false;
  local_2d8.type_id = 0xc0;
  local_2d8.position.x = 'k';
  local_2d8.position.y = '$';
  local_2d8.position.z = '\0';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar32->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2d8);
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = '\x1c';
  local_2d8.position.x = '\x17';
  local_2d8.position.y = '\x13';
  local_2d8.position.z = '\b';
  local_2d8.behavior_id = 0;
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  local_2d8.palette = '\0';
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.dialogue = '\0';
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = '\x1c';
  local_228[1] = '\x1f';
  local_228[2] = '\x13';
  local_228[3] = '\b';
  local_228._18_2_ = 0;
  local_228[4] = false;
  local_228[5] = false;
  local_228[6] = false;
  local_228[7] = '\0';
  local_228[8] = '\0';
  local_228[9] = '\0';
  local_228[10] = false;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = false;
  local_228[0xf] = false;
  local_228[0x10] = '\0';
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = '\x1c';
  local_278[1] = '\x13';
  local_278[2] = '\x17';
  local_278[3] = '\b';
  local_278._18_2_ = 0;
  local_278[4] = false;
  local_278[5] = false;
  local_278[6] = false;
  local_278[7] = '\0';
  local_278[8] = '\0';
  local_278[9] = '\0';
  local_278[10] = false;
  local_278[0xb] = false;
  local_278[0xc] = false;
  local_278[0xd] = false;
  local_278[0xe] = false;
  local_278[0xf] = false;
  local_278[0x10] = '\0';
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  pEVar35 = (Entity *)operator_new(0x58);
  local_1c8.type_id = '\x1c';
  local_1c8.position.x = '\x13';
  local_1c8.position.y = '\x1f';
  local_1c8.position.z = '\b';
  local_1c8.behavior_id = 0;
  local_1c8.position.half_x = false;
  local_1c8.position.half_y = false;
  local_1c8.position.half_z = false;
  local_1c8.orientation = '\0';
  local_1c8.palette = '\0';
  local_1c8.speed = '\0';
  local_1c8.fightable = false;
  local_1c8.liftable = false;
  local_1c8.can_pass_through = false;
  local_1c8.appear_after_player_moved_away = false;
  local_1c8.gravity_immune = false;
  local_1c8.talkable = false;
  local_1c8.dialogue = '\0';
  local_1c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1c8.persistence_flag.byte = 0xff;
  local_1c8.persistence_flag.bit = 0xff;
  local_1c8.flag_unknown_2_3 = false;
  local_1c8.flag_unknown_2_4 = false;
  local_1c8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_1c8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_1c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_178.type_id = 'g';
  local_178.position.x = '\x19';
  local_178.position.y = '!';
  local_178.position.z = '\0';
  local_178.position.half_x = false;
  local_178.position.half_y = false;
  local_178.position.half_z = false;
  local_178.orientation = '\0';
  local_178.palette = '\0';
  local_178.speed = '\0';
  local_178.fightable = false;
  local_178.liftable = false;
  local_178.can_pass_through = false;
  local_178.appear_after_player_moved_away = true;
  local_178.gravity_immune = false;
  local_178.talkable = false;
  local_178.dialogue = '\0';
  local_178.behavior_id = 0x6a;
  local_178.entity_to_use_tiles_from = (Entity *)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_178.persistence_flag.byte = 0xff;
  local_178.persistence_flag.bit = 0xff;
  local_178.flag_unknown_2_3 = false;
  local_178.flag_unknown_2_4 = false;
  local_178.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_178);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_178.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_128.type_id = 'g';
  local_128.position.x = '!';
  local_128.position.y = '\x19';
  local_128.position.z = '\0';
  local_128.position.half_x = false;
  local_128.position.half_y = false;
  local_128.position.half_z = false;
  local_128.orientation = '\x01';
  local_128.palette = '\0';
  local_128.speed = '\0';
  local_128.fightable = false;
  local_128.liftable = false;
  local_128.can_pass_through = false;
  local_128.appear_after_player_moved_away = false;
  local_128.gravity_immune = false;
  local_128.talkable = false;
  local_128.dialogue = '\0';
  local_128.behavior_id = 0x6a;
  local_128.entity_to_use_tiles_from = (Entity *)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_128.persistence_flag.byte = 0xff;
  local_128.persistence_flag.bit = 0xff;
  local_128.flag_unknown_2_3 = false;
  local_128.flag_unknown_2_4 = false;
  local_128.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_128);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_128.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_d0.type_id = 'Q';
  local_d0.position.x = ' ';
  local_d0.position.y = '\x19';
  local_d0.position.z = '\x04';
  local_d0.position.half_x = true;
  local_d0.position.half_y = true;
  local_d0.position.half_z = false;
  local_d0.orientation = '\0';
  local_d0.palette = '\x01';
  local_d0.behavior_id = 0;
  local_d0.speed = '\0';
  local_d0.fightable = false;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = false;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.entity_to_use_tiles_from = (Entity *)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_d0);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_d0.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  this->_room_4 = pMVar32;
  local_2d8._0_2_ = this->_room_3->_id;
  local_2d8._6_2_ = pMVar32->_id;
  local_2d8.position.y = '\x19';
  local_2d8.position.z = '\x13';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\x19';
  local_2d8.speed = '\"';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = World::map(w,0x3e);
  pMVar34 = World::map(w,0x137);
  pMVar32->_layout = pMVar34->_layout;
  pMVar34 = World::map(w,0x137);
  pMVar32->_blockset = pMVar34->_blockset;
  pMVar32->_palette = (MapPalette *)this_02;
  pMVar32->_background_music = '\x14';
  (pMVar32->_visited_flag).bit = '\x01';
  (pMVar32->_visited_flag).byte = 0xce;
  local_2d8.palette = 0xce;
  local_2d8.speed = '\0';
  local_2d8.fightable = true;
  local_2d8.liftable = true;
  local_2d8.type_id = 0xc0;
  local_2d8.position.x = 'k';
  local_2d8.position.y = '$';
  local_2d8.position.z = '\0';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar32->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2d8);
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = 'U';
  local_2d8.position.x = ' ';
  local_2d8.position.y = '\x13';
  local_2d8.position.z = '\x02';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  local_2d8.palette = '\x01';
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.dialogue = '\0';
  local_2d8.behavior_id = 0xd3;
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = 'g';
  local_228[1] = '\x19';
  local_228[2] = '!';
  local_228[3] = '\x02';
  local_228[4] = false;
  local_228[5] = false;
  local_228[6] = false;
  local_228[7] = '\0';
  local_228[8] = '\0';
  local_228[9] = '\0';
  local_228[10] = false;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = false;
  local_228[0xf] = false;
  local_228[0x10] = '\0';
  local_228._18_2_ = 0x380;
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = 'h';
  local_278[1] = '\x11';
  local_278[2] = '\x19';
  local_278[3] = '\x02';
  local_278[4] = false;
  local_278[5] = false;
  local_278[6] = false;
  local_278[7] = '\x01';
  local_278[8] = '\0';
  local_278[9] = '\0';
  local_278[10] = false;
  local_278[0xb] = false;
  local_278[0xc] = false;
  local_278[0xd] = false;
  local_278[0xe] = false;
  local_278[0xf] = false;
  local_278[0x10] = '\0';
  local_278._18_2_ = 0x6a;
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  pEVar35 = (Entity *)operator_new(0x58);
  local_1c8.type_id = '(';
  local_1c8.position.x = '\x19';
  local_1c8.position.y = '\x19';
  local_1c8.position.z = '\x03';
  local_1c8.position.half_x = true;
  local_1c8.position.half_y = true;
  local_1c8.behavior_id = 0;
  local_1c8.position.half_z = false;
  local_1c8.orientation = '\0';
  local_1c8.palette = '\0';
  local_1c8.speed = '\0';
  local_1c8.fightable = false;
  local_1c8.liftable = false;
  local_1c8.can_pass_through = false;
  local_1c8.appear_after_player_moved_away = false;
  local_1c8.gravity_immune = false;
  local_1c8.talkable = false;
  local_1c8.dialogue = '\0';
  local_1c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1c8.persistence_flag.byte = 0xff;
  local_1c8.persistence_flag.bit = 0xff;
  local_1c8.flag_unknown_2_3 = false;
  local_1c8.flag_unknown_2_4 = false;
  local_1c8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_1c8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_1c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  this->_room_5 = pMVar32;
  local_2d8._0_2_ = pMVar32->_id;
  local_2d8._6_2_ = this->_room_4->_id;
  local_2d8.position.y = '\x13';
  local_2d8.position.z = '\x19';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\"';
  local_2d8.speed = '\x19';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = World::map(w,0x3c);
  pMVar34 = World::map(w,0x162);
  pMVar32->_layout = pMVar34->_layout;
  pMVar34 = World::map(w,0x162);
  pMVar32->_blockset = pMVar34->_blockset;
  pMVar32->_palette = (MapPalette *)this_02;
  pMVar32->_background_music = '\x14';
  (pMVar32->_visited_flag).bit = '\x02';
  (pMVar32->_visited_flag).byte = 0xce;
  local_2d8.palette = 0xce;
  local_2d8.speed = '\0';
  local_2d8.fightable = true;
  local_2d8.liftable = false;
  local_2d8.type_id = 0xc0;
  local_2d8.position.x = 'k';
  local_2d8.position.y = '$';
  local_2d8.position.z = '\0';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar32->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2d8);
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = 0xab;
  local_2d8.position.x = '\x19';
  local_2d8.position.y = '\x1a';
  local_2d8.position.z = '\x02';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  local_2d8.palette = '\x01';
  local_2d8.behavior_id = 0;
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.dialogue = '\0';
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = 'h';
  local_228[1] = '\x11';
  local_228[2] = '\x19';
  local_228[3] = '\x02';
  local_228[4] = false;
  local_228[5] = false;
  local_228[6] = false;
  local_228[7] = '\x01';
  local_228._18_2_ = 0;
  local_228[0x10] = '\0';
  local_228[8] = '\0';
  local_228[9] = '\0';
  local_228[10] = false;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = false;
  local_228[0xf] = false;
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = 'h';
  local_278[1] = '\x19';
  local_278[2] = '\x11';
  local_278[3] = '\x02';
  local_278._18_2_ = 0;
  local_278[4] = false;
  local_278[5] = false;
  local_278[6] = false;
  local_278[7] = '\0';
  local_278[8] = '\0';
  local_278[9] = '\0';
  local_278[10] = false;
  local_278[0xb] = false;
  local_278[0xc] = false;
  local_278[0xd] = false;
  local_278[0xe] = false;
  local_278[0xf] = false;
  local_278[0x10] = '\0';
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  pEVar35 = (Entity *)operator_new(0x58);
  local_1c8.type_id = 'g';
  local_1c8.position.x = '!';
  local_1c8.position.y = '\x19';
  local_1c8.position.z = '\x02';
  local_1c8.position.half_x = false;
  local_1c8.position.half_y = false;
  local_1c8.position.half_z = false;
  local_1c8.orientation = '\x01';
  local_1c8.palette = '\0';
  local_1c8.speed = '\0';
  local_1c8.fightable = false;
  local_1c8.liftable = false;
  local_1c8.can_pass_through = false;
  local_1c8.appear_after_player_moved_away = false;
  local_1c8.gravity_immune = false;
  local_1c8.talkable = false;
  local_1c8.dialogue = '\0';
  local_1c8.behavior_id = 0x6a;
  local_1c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1c8.persistence_flag.byte = 0xff;
  local_1c8.persistence_flag.bit = 0xff;
  local_1c8.flag_unknown_2_3 = false;
  local_1c8.flag_unknown_2_4 = false;
  local_1c8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_1c8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_1c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  this->_room_6 = pMVar32;
  local_2d8._0_2_ = pMVar32->_id;
  local_2d8._6_2_ = this->_room_5->_id;
  local_2d8.position.y = '\x19';
  local_2d8.position.z = '\x13';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\x19';
  local_2d8.speed = '\"';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  local_2d8._0_2_ = this->_room_6->_id;
  local_2d8._6_2_ = this->_room_2->_id;
  local_2d8.position.y = '\x13';
  local_2d8.position.z = '\x19';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\"';
  local_2d8.speed = '\x19';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = World::map(w,0x4f);
  pMVar34 = World::map(w,0x156);
  pMVar32->_layout = pMVar34->_layout;
  pMVar34 = World::map(w,0x156);
  pMVar32->_blockset = pMVar34->_blockset;
  pMVar32->_palette = (MapPalette *)this_02;
  (pMVar32->_visited_flag).bit = '\x03';
  (pMVar32->_visited_flag).byte = 0xce;
  pMVar32->_background_music = '\x0f';
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = 0xa5;
  local_2d8.position.x = '\x19';
  local_2d8.position.y = '\x13';
  local_2d8.position.z = '\x04';
  local_2d8.position.half_x = true;
  local_2d8.position.half_y = true;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\x02';
  local_2d8.behavior_id = 0;
  local_2d8.palette = '\0';
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.dialogue = '\0';
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  (pEVar35->_attrs).fightable = false;
  (pEVar35->_attrs).behavior_id = 0;
  Map::add_entity(pMVar32,pEVar35);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = 0x9c;
  local_228[1] = '\x13';
  local_228[2] = '\x1f';
  local_228[3] = '\x02';
  local_228[4] = false;
  local_228[5] = false;
  local_228[6] = false;
  local_228[7] = '\x01';
  local_228._18_2_ = 0;
  local_228[8] = '\x03';
  local_228[9] = '\0';
  local_228[10] = false;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = false;
  local_228[0xf] = false;
  local_228[0x10] = '\0';
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  Map::add_entity(pMVar32,pEVar35);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_278,
             "Foxy: The final challenge is very\nclose, you should take some rest.\x1e\nYou are about to fight the very\nsource of Gola\'s power, what made\nits reign of terror possible.\x1e\nPlease set this island free,\nonce and for all...\x03"
             ,(allocator<char> *)&local_1c8);
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar35,(string *)local_278);
  std::__cxx11::string::~string((string *)local_278);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = 0xc0;
  local_278[1] = '\x15';
  local_278[2] = '\x13';
  local_278[3] = '\x03';
  local_278[4] = false;
  local_278[5] = false;
  local_278[6] = false;
  local_278[7] = '\0';
  local_278[8] = '\x01';
  local_278[9] = '\0';
  local_278[10] = false;
  local_278[0xb] = true;
  local_278[0xc] = false;
  local_278[0xd] = false;
  local_278[0xe] = false;
  local_278[0xf] = false;
  local_278._18_2_ = 0;
  local_278[0x10] = '\0';
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  pEVar35 = (Entity *)operator_new(0x58);
  local_1c8.type_id = 0xc0;
  local_1c8.position.x = '\x1e';
  local_1c8.position.y = '\x13';
  local_1c8.position.z = '\x03';
  local_1c8.position.half_x = false;
  local_1c8.position.half_y = false;
  local_1c8.position.half_z = false;
  local_1c8.orientation = '\0';
  local_1c8.palette = '\x01';
  local_1c8.speed = '\0';
  local_1c8.fightable = false;
  local_1c8.liftable = true;
  local_1c8.can_pass_through = false;
  local_1c8.appear_after_player_moved_away = false;
  local_1c8.gravity_immune = false;
  local_1c8.talkable = false;
  local_1c8.behavior_id = 0;
  local_1c8.dialogue = '\0';
  local_1c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1c8.persistence_flag.byte = 0xff;
  local_1c8.persistence_flag.bit = 0xff;
  local_1c8.flag_unknown_2_3 = false;
  local_1c8.flag_unknown_2_4 = false;
  local_1c8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_1c8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_1c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_178.type_id = 0xed;
  local_178.position.x = '\x15';
  local_178.position.y = '\x14';
  local_178.position.z = '\x03';
  local_178.position.half_x = false;
  local_178.position.half_y = false;
  local_178.position.half_z = false;
  local_178.orientation = '\0';
  local_178.palette = '\x01';
  local_178.speed = '\0';
  local_178.fightable = false;
  local_178.liftable = true;
  local_178.can_pass_through = false;
  local_178.appear_after_player_moved_away = false;
  local_178.gravity_immune = false;
  local_178.talkable = false;
  local_178.behavior_id = 0;
  local_178.dialogue = '\0';
  local_178.entity_to_use_tiles_from = (Entity *)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_178.persistence_flag.byte = 0xff;
  local_178.persistence_flag.bit = 0xff;
  local_178.flag_unknown_2_3 = false;
  local_178.flag_unknown_2_4 = false;
  local_178.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_178);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_178.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_128.type_id = 0xed;
  local_128.position.x = '\x1e';
  local_128.position.y = '\x14';
  local_128.position.z = '\x03';
  local_128.position.half_x = false;
  local_128.position.half_y = false;
  local_128.position.half_z = false;
  local_128.orientation = '\0';
  local_128.palette = '\x01';
  local_128.speed = '\0';
  local_128.fightable = false;
  local_128.liftable = true;
  local_128.can_pass_through = false;
  local_128.appear_after_player_moved_away = false;
  local_128.gravity_immune = false;
  local_128.talkable = false;
  local_128.behavior_id = 0;
  local_128.dialogue = '\0';
  local_128.entity_to_use_tiles_from = (Entity *)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_128.persistence_flag.byte = 0xff;
  local_128.persistence_flag.bit = 0xff;
  local_128.flag_unknown_2_3 = false;
  local_128.flag_unknown_2_4 = false;
  local_128.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_128);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_128.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  this->_room_7 = pMVar32;
  local_2d8._0_2_ = pMVar32->_id;
  local_2d8._6_2_ = this->_room_6->_id;
  local_2d8.position.y = '\x13';
  local_2d8.position.z = '\x19';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\"';
  local_2d8.speed = '\x19';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = (Map *)operator_new(0xe0);
  pMVar34 = World::map(w,0xb5);
  Map::Map(pMVar32,pMVar34);
  Map::clear_entities(pMVar32);
  pMVar32->_id = 0x330;
  pMVar32->_palette = (MapPalette *)this_02;
  pMVar32->_background_music = '\x14';
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = '\x06';
  local_2d8.position.x = '\x15';
  local_2d8.position.y = '\x15';
  local_2d8.position.z = '\x01';
  local_2d8.behavior_id = 0;
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\0';
  local_2d8.palette = '\0';
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.dialogue = '\0';
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = '\x06';
  local_228[1] = '\x15';
  local_228[2] = '\x10';
  local_228[3] = '\x01';
  local_228._18_2_ = 0;
  local_228[4] = false;
  local_228[5] = false;
  local_228[6] = false;
  local_228[7] = '\0';
  local_228[8] = '\0';
  local_228[9] = '\0';
  local_228[10] = false;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = false;
  local_228[0xf] = false;
  local_228[0x10] = '\0';
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = '\x06';
  local_278[1] = '\x10';
  local_278[2] = '\x10';
  local_278[3] = '\x01';
  local_278._18_2_ = 0;
  local_278[4] = false;
  local_278[5] = false;
  local_278[6] = false;
  local_278[7] = '\0';
  local_278[8] = '\0';
  local_278[9] = '\0';
  local_278[10] = false;
  local_278[0xb] = false;
  local_278[0xc] = false;
  local_278[0xd] = false;
  local_278[0xe] = false;
  local_278[0xf] = false;
  local_278[0x10] = '\0';
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  pEVar35 = (Entity *)operator_new(0x58);
  local_1c8.type_id = 'g';
  local_1c8.position.x = '\x1a';
  local_1c8.position.y = '\x12';
  local_1c8.position.z = '\x01';
  local_1c8.position.half_x = false;
  local_1c8.position.half_y = false;
  local_1c8.position.half_z = false;
  local_1c8.orientation = '\x01';
  local_1c8.palette = '\0';
  local_1c8.speed = '\0';
  local_1c8.fightable = false;
  local_1c8.liftable = false;
  local_1c8.can_pass_through = false;
  local_1c8.appear_after_player_moved_away = true;
  local_1c8.gravity_immune = false;
  local_1c8.talkable = false;
  local_1c8.dialogue = '\0';
  local_1c8.behavior_id = 0x311;
  local_1c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1c8.persistence_flag.byte = 0xff;
  local_1c8.persistence_flag.bit = 0xff;
  local_1c8.flag_unknown_2_3 = false;
  local_1c8.flag_unknown_2_4 = false;
  local_1c8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_1c8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_1c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_178.type_id = 'r';
  local_178.position.x = '\x12';
  local_178.position.y = '\x13';
  local_178.position.z = '\0';
  local_178.position.half_x = false;
  local_178.position.half_y = false;
  local_178.position.half_z = true;
  local_178.orientation = '\0';
  local_178.palette = '\0';
  local_178.speed = '\0';
  local_178.fightable = false;
  local_178.liftable = false;
  local_178.can_pass_through = false;
  local_178.appear_after_player_moved_away = false;
  local_178.gravity_immune = false;
  local_178.talkable = false;
  local_178.dialogue = '\0';
  local_178.behavior_id = 0x6a;
  local_178.entity_to_use_tiles_from = (Entity *)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_178.persistence_flag.byte = 0xff;
  local_178.persistence_flag.bit = 0xff;
  local_178.flag_unknown_2_3 = false;
  local_178.flag_unknown_2_4 = false;
  local_178.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_178);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_178.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_128.type_id = 'r';
  local_128.position.x = '\x13';
  local_128.position.y = '\x13';
  local_128.position.z = '\0';
  local_128.position.half_x = false;
  local_128.position.half_y = false;
  local_128.position.half_z = true;
  local_128.orientation = '\0';
  local_128.palette = '\0';
  local_128.speed = '\0';
  local_128.fightable = false;
  local_128.liftable = false;
  local_128.can_pass_through = false;
  local_128.appear_after_player_moved_away = false;
  local_128.gravity_immune = false;
  local_128.talkable = false;
  local_128.dialogue = '\0';
  local_128.behavior_id = 0x6a;
  local_128.entity_to_use_tiles_from = (Entity *)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_128.persistence_flag.byte = 0xff;
  local_128.persistence_flag.bit = 0xff;
  local_128.flag_unknown_2_3 = false;
  local_128.flag_unknown_2_4 = false;
  local_128.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_128);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_128.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  World::add_map(w,pMVar32);
  this->_room_8 = pMVar32;
  local_2d8._0_2_ = this->_room_2->_id;
  local_2d8._6_2_ = pMVar32->_id;
  local_2d8.position.y = '\x13';
  local_2d8.position.z = '\x19';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\x1b';
  local_2d8.speed = '\x12';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = World::map(w,0x295);
  pMVar34 = World::map(w,0xaf);
  pMVar32->_layout = pMVar34->_layout;
  pMVar34 = World::map(w,0xaf);
  pMVar32->_blockset = pMVar34->_blockset;
  pMVar32->_palette = (MapPalette *)this_02;
  pMVar32->_background_music = '\x14';
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = 'h';
  local_2d8.position.x = '\x1f';
  local_2d8.position.y = '\x11';
  local_2d8.position.z = '\a';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\x02';
  local_2d8.behavior_id = 0;
  local_2d8.dialogue = '\0';
  local_2d8.palette = '\0';
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = 'J';
  local_228[1] = '\x1b';
  local_228[2] = '!';
  local_228[3] = '\x01';
  local_228[4] = false;
  local_228[5] = false;
  local_228[6] = true;
  local_228[7] = '\0';
  local_228[8] = '\0';
  local_228[9] = '\x03';
  local_228[10] = true;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = true;
  local_228[0xf] = false;
  local_228[0x10] = '\0';
  local_228._18_2_ = 0x173;
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = 'J';
  local_278[1] = '\x1f';
  local_278[2] = '!';
  local_278[3] = '\x01';
  local_278[4] = false;
  local_278[5] = false;
  local_278[6] = true;
  local_278[7] = '\0';
  local_278[8] = '\0';
  local_278[9] = '\x03';
  local_278[10] = true;
  local_278[0xb] = false;
  local_278[0xc] = false;
  local_278[0xd] = false;
  local_278[0xe] = true;
  local_278[0xf] = false;
  local_278[0x10] = '\0';
  local_278._18_2_ = 0x173;
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  pEVar35 = (Entity *)operator_new(0x58);
  local_1c8.type_id = 'J';
  local_1c8.position.x = '\x1d';
  local_1c8.position.y = '0';
  local_1c8.position.z = '\x01';
  local_1c8.position.half_x = false;
  local_1c8.position.half_y = false;
  local_1c8.position.half_z = false;
  local_1c8.orientation = '\0';
  local_1c8.palette = '\0';
  local_1c8.speed = '\x03';
  local_1c8.fightable = true;
  local_1c8.liftable = false;
  local_1c8.can_pass_through = false;
  local_1c8.appear_after_player_moved_away = false;
  local_1c8.gravity_immune = true;
  local_1c8.talkable = false;
  local_1c8.dialogue = '\0';
  local_1c8.behavior_id = 0x173;
  local_1c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1c8.persistence_flag.byte = 0xff;
  local_1c8.persistence_flag.bit = 0xff;
  local_1c8.flag_unknown_2_3 = false;
  local_1c8.flag_unknown_2_4 = false;
  local_1c8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_1c8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_1c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_178.type_id = 'J';
  local_178.position.x = '\x1c';
  local_178.position.y = '3';
  local_178.position.z = '\x02';
  local_178.position.half_x = false;
  local_178.position.half_y = false;
  local_178.position.half_z = false;
  local_178.orientation = '\0';
  local_178.palette = '\0';
  local_178.speed = '\x04';
  local_178.fightable = true;
  local_178.liftable = false;
  local_178.can_pass_through = false;
  local_178.appear_after_player_moved_away = false;
  local_178.gravity_immune = true;
  local_178.talkable = false;
  local_178.dialogue = '\0';
  local_178.behavior_id = 0x4a;
  local_178.entity_to_use_tiles_from = (Entity *)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_178.persistence_flag.byte = 0xff;
  local_178.persistence_flag.bit = 0xff;
  local_178.flag_unknown_2_3 = false;
  local_178.flag_unknown_2_4 = false;
  local_178.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_178);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_178.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_128.type_id = 'J';
  local_128.position.x = '\x16';
  local_128.position.y = '3';
  local_128.position.z = '\x02';
  local_128.position.half_x = false;
  local_128.position.half_y = false;
  local_128.position.half_z = true;
  local_128.orientation = '\0';
  local_128.palette = '\0';
  local_128.speed = '\x04';
  local_128.fightable = true;
  local_128.liftable = false;
  local_128.can_pass_through = false;
  local_128.appear_after_player_moved_away = false;
  local_128.gravity_immune = true;
  local_128.talkable = false;
  local_128.dialogue = '\0';
  local_128.behavior_id = 0x4a;
  local_128.entity_to_use_tiles_from = (Entity *)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_128.persistence_flag.byte = 0xff;
  local_128.persistence_flag.bit = 0xff;
  local_128.flag_unknown_2_3 = false;
  local_128.flag_unknown_2_4 = false;
  local_128.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_128);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_128.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_d0.type_id = 'J';
  local_d0.position.x = '\x10';
  local_d0.position.y = '3';
  local_d0.position.z = '\x02';
  local_d0.position.half_x = false;
  local_d0.position.half_y = false;
  local_d0.position.half_z = false;
  local_d0.orientation = '\0';
  local_d0.palette = '\0';
  local_d0.speed = '\x04';
  local_d0.fightable = true;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = true;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.behavior_id = 0x4a;
  local_d0.entity_to_use_tiles_from = (Entity *)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_d0);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_d0.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_80.type_id = 'J';
  local_80.position.x = '\x1f';
  local_80.position.y = '%';
  local_80.position.z = '\x02';
  local_80.position.half_x = false;
  local_80.position.half_y = false;
  local_80.position.half_z = false;
  local_80.orientation = '\0';
  local_80.palette = '\0';
  local_80.speed = '\x04';
  local_80.fightable = true;
  local_80.liftable = false;
  local_80.can_pass_through = false;
  local_80.appear_after_player_moved_away = false;
  local_80.gravity_immune = true;
  local_80.talkable = false;
  local_80.dialogue = '\0';
  local_80.behavior_id = 0x4a;
  local_80.entity_to_use_tiles_from = (Entity *)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_80.persistence_flag.byte = 0xff;
  local_80.persistence_flag.bit = 0xff;
  local_80.flag_unknown_2_3 = false;
  local_80.flag_unknown_2_4 = false;
  local_80.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_80);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_80.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  this->_room_9 = pMVar32;
  local_2d8._0_2_ = pMVar32->_id;
  local_2d8._6_2_ = this->_room_8->_id;
  local_2d8.position.y = '\x1f';
  local_2d8.position.z = '\x12';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\x12';
  local_2d8.speed = '\x13';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = add_gh_stairs_room((RandomizerWorld *)w,(MapPalette *)this_02,0x331);
  this->_room_10 = pMVar32;
  local_2d8._0_2_ = this->_room_9->_id;
  local_2d8._6_2_ = pMVar32->_id;
  local_2d8.position.y = '\x10';
  local_2d8.position.z = '3';
  local_2d8.position.half_x = true;
  local_2d8.palette = '-';
  local_2d8.speed = '\x16';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = add_gh_stairs_room((RandomizerWorld *)w,(MapPalette *)local_280,0x332);
  this->_room_11 = pMVar32;
  local_2d8._0_2_ = this->_room_10->_id;
  local_2d8._6_2_ = pMVar32->_id;
  local_2d8.position.y = '\x14';
  local_2d8.position.z = '\x16';
  local_2d8.position.half_x = true;
  local_2d8.palette = '-';
  local_2d8.speed = '\x16';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = add_gh_stairs_room((RandomizerWorld *)w,(MapPalette *)local_288,0x333);
  this->_room_12 = pMVar32;
  local_2d8._0_2_ = this->_room_11->_id;
  local_2d8._6_2_ = pMVar32->_id;
  local_2d8.position.y = '\x14';
  local_2d8.position.z = '\x16';
  local_2d8.position.half_x = true;
  local_2d8.palette = '-';
  local_2d8.speed = '\x16';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = (Map *)operator_new(0xe0);
  pMVar34 = World::map(w,0x140);
  Map::Map(pMVar32,pMVar34);
  Map::clear_entities(pMVar32);
  pMVar32->_id = 0x334;
  pMVar32->_palette = (MapPalette *)local_288;
  pMVar32->_background_music = '\x12';
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = 'h';
  local_2d8.position.x = '\x11';
  local_2d8.position.y = '\x19';
  local_2d8.position.z = '\x02';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\x01';
  local_2d8.behavior_id = 0;
  local_2d8.dialogue = '\0';
  local_2d8.palette = '\0';
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = 'h';
  local_228[1] = '\x19';
  local_228[2] = '\x11';
  local_228[3] = '\x02';
  local_228._18_2_ = 0;
  local_228[4] = false;
  local_228[5] = false;
  local_228[6] = false;
  local_228[7] = '\0';
  local_228[8] = '\0';
  local_228[9] = '\0';
  local_228[10] = false;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = false;
  local_228[0xf] = false;
  local_228[0x10] = '\0';
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = '\\';
  local_278[1] = '\x19';
  local_278[2] = '\x19';
  local_278[3] = '\0';
  local_278[4] = false;
  local_278[5] = false;
  local_278[6] = true;
  local_278[7] = '\0';
  local_278[8] = '\0';
  local_278[9] = '\0';
  local_278[10] = false;
  local_278[0xb] = false;
  local_278[0xc] = false;
  local_278[0xd] = false;
  local_278[0xe] = false;
  local_278[0xf] = false;
  local_278[0x10] = '\0';
  local_278._18_2_ = 0x46;
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  pEVar35 = (Entity *)operator_new(0x58);
  local_1c8.type_id = 'd';
  local_1c8.position.x = '\x16';
  local_1c8.position.y = '\x19';
  local_1c8.position.z = '\x02';
  local_1c8.position.half_x = false;
  local_1c8.position.half_y = true;
  local_1c8.position.half_z = false;
  local_1c8.orientation = '\x01';
  local_1c8.behavior_id = 0;
  local_1c8.dialogue = '\0';
  local_1c8.palette = '\0';
  local_1c8.speed = '\0';
  local_1c8.fightable = false;
  local_1c8.liftable = false;
  local_1c8.can_pass_through = false;
  local_1c8.appear_after_player_moved_away = false;
  local_1c8.gravity_immune = false;
  local_1c8.talkable = false;
  local_1c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1c8.persistence_flag.byte = 0xff;
  local_1c8.persistence_flag.bit = 0xff;
  local_1c8.flag_unknown_2_3 = false;
  local_1c8.flag_unknown_2_4 = false;
  local_1c8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_1c8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_1c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  World::add_map(w,pMVar32);
  this->_room_13 = pMVar32;
  local_2d8._0_2_ = this->_room_12->_id;
  local_2d8._6_2_ = pMVar32->_id;
  local_2d8.position.y = '\x14';
  local_2d8.position.z = '\x16';
  local_2d8.position.half_x = true;
  local_2d8.palette = '\"';
  local_2d8.speed = '\x19';
  local_2d8.fightable = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (this_00,(MapConnection *)&local_2d8);
  pMVar32 = (Map *)operator_new(0xe0);
  pMVar34 = World::map(w,0x6f);
  Map::Map(pMVar32,pMVar34);
  Map::clear_entities(pMVar32);
  pMVar32->_id = 0x335;
  pMVar32->_palette = local_1d0;
  pMVar32->_background_music = '\x15';
  pEVar35 = (Entity *)operator_new(0x58);
  local_2d8.type_id = 0xa5;
  local_2d8.position.x = '\x1d';
  local_2d8.position.y = '\x16';
  local_2d8.position.z = '\x04';
  local_2d8.position.half_x = false;
  local_2d8.position.half_y = false;
  local_2d8.position.half_z = false;
  local_2d8.orientation = '\x02';
  local_2d8.palette = '\x01';
  local_2d8.behavior_id = 0;
  local_2d8.speed = '\0';
  local_2d8.fightable = false;
  local_2d8.liftable = false;
  local_2d8.can_pass_through = false;
  local_2d8.appear_after_player_moved_away = false;
  local_2d8.gravity_immune = false;
  local_2d8.talkable = false;
  local_2d8.dialogue = '\0';
  local_2d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_2d8.persistence_flag.byte = 0xff;
  local_2d8.persistence_flag.bit = 0xff;
  local_2d8.flag_unknown_2_3 = false;
  local_2d8.flag_unknown_2_4 = false;
  local_2d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_2d8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_2d8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_228[0] = 'I';
  local_228[1] = '\x1a';
  local_228[2] = '\x1e';
  local_228[3] = '\x04';
  local_228[4] = false;
  local_228[5] = false;
  local_228[6] = false;
  local_228[7] = '\0';
  local_228[8] = '\x01';
  local_228[9] = '\x04';
  local_228[10] = true;
  local_228[0xb] = false;
  local_228[0xc] = false;
  local_228[0xd] = false;
  local_228[0xe] = true;
  local_228[0xf] = false;
  local_228[0x10] = '\0';
  local_228._18_2_ = 0x173;
  local_228._24_8_ = (Entity *)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &PTR_to_json_abi_cxx11__002468a8;
  local_1e8 = 0xff;
  local_1e6 = 0xff;
  local_1e0._0_1_ = false;
  local_1e0._1_1_ = false;
  local_1de = false;
  Entity::Entity(pEVar35,(Attributes *)local_228);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_208);
  pEVar35 = (Entity *)operator_new(0x58);
  local_278[0] = 'Q';
  local_278[1] = '\x1d';
  local_278[2] = '\"';
  local_278[3] = '\x05';
  local_278[4] = false;
  local_278[5] = false;
  local_278[6] = true;
  local_278[7] = '\0';
  local_278._18_2_ = 0;
  local_278[8] = '\x01';
  local_278[9] = '\0';
  local_278[10] = false;
  local_278[0xb] = false;
  local_278[0xc] = false;
  local_278[0xd] = false;
  local_278[0xe] = false;
  local_278[0xf] = false;
  local_278[0x10] = '\0';
  local_278._24_8_ = (Entity *)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = &PTR_to_json_abi_cxx11__002468a8;
  local_238 = 0xff;
  local_236 = 0xff;
  local_230._0_1_ = false;
  local_230._1_1_ = false;
  local_22e = false;
  Entity::Entity(pEVar35,(Attributes *)local_278);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_258);
  pEVar35 = (Entity *)operator_new(0x58);
  local_1c8.type_id = 'Q';
  local_1c8.position.x = '\x1e';
  local_1c8.position.y = '\"';
  local_1c8.position.z = '\x05';
  local_1c8.position.half_x = false;
  local_1c8.position.half_y = false;
  local_1c8.position.half_z = true;
  local_1c8.orientation = '\0';
  local_1c8.behavior_id = 0;
  local_1c8.palette = '\x01';
  local_1c8.speed = '\0';
  local_1c8.fightable = false;
  local_1c8.liftable = false;
  local_1c8.can_pass_through = false;
  local_1c8.appear_after_player_moved_away = false;
  local_1c8.gravity_immune = false;
  local_1c8.talkable = false;
  local_1c8.dialogue = '\0';
  local_1c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1c8.persistence_flag.byte = 0xff;
  local_1c8.persistence_flag.bit = 0xff;
  local_1c8.flag_unknown_2_3 = false;
  local_1c8.flag_unknown_2_4 = false;
  local_1c8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_1c8);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_1c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar35 = (Entity *)operator_new(0x58);
  local_178.type_id = 'Q';
  local_178.position.x = '\x1f';
  local_178.position.y = '\"';
  local_178.position.z = '\x05';
  local_178.position.half_x = false;
  local_178.position.half_y = false;
  local_178.position.half_z = true;
  local_178.orientation = '\0';
  local_178.palette = '\x01';
  local_178.behavior_id = 0;
  local_178.speed = '\0';
  local_178.fightable = false;
  local_178.liftable = false;
  local_178.can_pass_through = false;
  local_178.appear_after_player_moved_away = false;
  local_178.gravity_immune = false;
  local_178.talkable = false;
  local_178.dialogue = '\0';
  local_178.entity_to_use_tiles_from = (Entity *)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_178.persistence_flag.byte = 0xff;
  local_178.persistence_flag.bit = 0xff;
  local_178.flag_unknown_2_3 = false;
  local_178.flag_unknown_2_4 = false;
  local_178.flag_unknown_3_5 = false;
  Entity::Entity(pEVar35,&local_178);
  Map::add_entity(pMVar32,pEVar35);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_178.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  World::add_map(w,pMVar32);
  this->_room_14 = pMVar32;
  this->_room_13->_fall_destination = pMVar32->_id;
  return;
}

Assistant:

void PatchAddGolasHeart::alter_world(World& w)
{
    RandomizerWorld& world = reinterpret_cast<RandomizerWorld&>(w);

    MapPalette* golas_heart_palette = build_golas_heart_palette(world);
    MapPalette* stairs_palette_2 = build_greyscale_palette(world, world.map(MAP_LAKE_SHRINE_342)->palette());
    MapPalette* stairs_palette_1 = build_transition_palette(world, golas_heart_palette, stairs_palette_2);
    MapPalette* final_fight_palette = build_greyscale_palette(world, world.map(MAP_NOLE_ARENA)->palette(), 0.4);

    _room_1 = add_gh_room_1(world);

    // Archway
    _room_2 = add_gh_room_2(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_1->id(), 33, 48, _room_2->id(), 25, 34, 2));

    // Double red spinner room
    _room_3 = add_gh_room_3(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 25, 23, _room_3->id(), 25, 34, 2));

    // Lizards room
    _room_4 = add_gh_room_4(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_3->id(), 25, 19, _room_4->id(), 25, 34, 2));

    // Solo unicorn room
    _room_5 = add_gh_room_5(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_5->id(), 19, 25, _room_4->id(), 34, 25, 4));

    // Mirrors T-room
    _room_6 = add_gh_room_6(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_6->id(), 25, 19, _room_5->id(), 25, 34, 2));
    world.map_connections().emplace_back(MapConnection(_room_6->id(), 19, 25, _room_2->id(), 34, 25, 4));

    // Healing room
    _room_7 = add_gh_room_7(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_7->id(), 19, 25, _room_6->id(), 34, 25, 4));

    // WS orc arena
    _room_8 = add_gh_room_8(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 19, 25, _room_8->id(), 27, 18, 4));

    // WS underground
    _room_9 = add_gh_room_9(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_9->id(), 31, 18, _room_8->id(), 18, 19, 10));

    // Giant stairs
    _room_10 = add_gh_stairs_room(world, golas_heart_palette, MAP_GOLAS_HEART_STAIRS_1);
    world.map_connections().emplace_back(MapConnection(_room_9->id(), 16, 51, _room_10->id(), 45, 22, 4));
    _room_11 = add_gh_stairs_room(world, stairs_palette_1, MAP_GOLAS_HEART_STAIRS_2);
    world.map_connections().emplace_back(MapConnection(_room_10->id(), 20, 22, _room_11->id(), 45, 22, 4));
    _room_12 = add_gh_stairs_room(world, stairs_palette_2, MAP_GOLAS_HEART_STAIRS_3);
    world.map_connections().emplace_back(MapConnection(_room_11->id(), 20, 22, _room_12->id(), 45, 22, 4));

    // Falling room
    _room_13 = add_gh_falling_room(world, stairs_palette_2);
    world.map_connections().emplace_back(MapConnection(_room_12->id(), 20, 22, _room_13->id(), 34, 25, 4));

    // Dark Nole room
    _room_14 = add_gh_final_fight_room(world, final_fight_palette);
    _room_13->fall_destination(_room_14->id());
}